

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixCase::ShaderMatrixCase
          (ShaderMatrixCase *this,TestContext *testCtx,string *name,string *desc,ShaderInput *in0,
          ShaderInput *in1,MatrixOp op,bool isVertexCase)

{
  DataType DVar1;
  MatrixShaderEvaluator *this_00;
  MatrixShaderEvalFunc evalFunc;
  bool isVertexCase_local;
  ShaderInput *in1_local;
  ShaderInput *in0_local;
  string *desc_local;
  string *name_local;
  TestContext *testCtx_local;
  ShaderMatrixCase *this_local;
  
  this_00 = (MatrixShaderEvaluator *)operator_new(0x20);
  evalFunc = MatrixCaseUtils::getEvalFunc(in0,in1,op);
  MatrixShaderEvaluator::MatrixShaderEvaluator(this_00,evalFunc,in0->inputType,in1->inputType);
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,desc,isVertexCase,(ShaderEvaluator *)this_00
             ,(UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderMatrixCase_016a87a8;
  (this->m_in0).precision = in0->precision;
  DVar1 = in0->dataType;
  (this->m_in0).inputType = in0->inputType;
  (this->m_in0).dataType = DVar1;
  (this->m_in1).precision = in1->precision;
  DVar1 = in1->dataType;
  (this->m_in1).inputType = in1->inputType;
  (this->m_in1).dataType = DVar1;
  this->m_op = op;
  setupShader(this);
  return;
}

Assistant:

ShaderMatrixCase::ShaderMatrixCase (tcu::TestContext&	testCtx,
									const std::string&	name,
									const std::string&	desc,
									const ShaderInput&	in0,
									const ShaderInput&	in1,
									MatrixOp			op,
									bool				isVertexCase)
	: ShaderRenderCase	(testCtx,
						 name,
						 desc,
						 isVertexCase,
						 new MatrixShaderEvaluator(getEvalFunc(in0, in1, op), in0.inputType, in1.inputType),
						 DE_NULL /* uniform setup */,
						 DE_NULL /* attribute setup */)
	, m_in0				(in0)
	, m_in1				(in1)
	, m_op				(op)
{
	setupShader();
}